

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void mainfunc(LexState *ls,FuncState *fs)

{
  undefined1 local_48 [8];
  expdesc v;
  BlockCnt bl;
  FuncState *fs_local;
  LexState *ls_local;
  
  open_func(ls,fs,(BlockCnt *)&v.t);
  fs->f->is_vararg = '\x01';
  init_exp((expdesc *)local_48,VLOCAL,0);
  newupvalue(fs,ls->envn,(expdesc *)local_48);
  luaX_next(ls);
  statlist(ls);
  check(ls,0x121);
  close_func(ls);
  return;
}

Assistant:

static void mainfunc (LexState *ls, FuncState *fs) {
  BlockCnt bl;
  expdesc v;
  open_func(ls, fs, &bl);
  fs->f->is_vararg = 1;  /* main function is always declared vararg */
  init_exp(&v, VLOCAL, 0);  /* create and... */
  newupvalue(fs, ls->envn, &v);  /* ...set environment upvalue */
  luaX_next(ls);  /* read first token */
  statlist(ls);  /* parse main body */
  check(ls, TK_EOS);
  close_func(ls);
}